

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_slt(TCGContext_conflict11 *tcg_ctx,TCGv_i64 ret,TCGv_i64 s1,TCGv_i64 s2)

{
  TCGv_i64 s2_local;
  TCGv_i64 s1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict11 *tcg_ctx_local;
  
  tcg_gen_setcond_i64_riscv64(tcg_ctx,TCG_COND_LT,ret,s1,s2);
  return;
}

Assistant:

static void gen_slt(DisasContext *ctx, uint32_t opc,
                    int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);
    switch (opc) {
    case OPC_SLT:
        tcg_gen_setcond_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case OPC_SLTU:
        tcg_gen_setcond_tl(tcg_ctx, TCG_COND_LTU, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}